

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

void __thiscall rest_rpc::rpc_client::error_callback(rpc_client *this,error_code *ec)

{
  error_code __args;
  
  if ((this->err_cb_).super__Function_base._M_manager != (_Manager_type)0x0) {
    __args._4_4_ = 0;
    __args._M_value = ec->_M_value;
    __args._M_cat = ec->_M_cat;
    std::function<void_(std::error_code)>::operator()(&this->err_cb_,__args);
  }
  if (this->enable_reconnect_ == true) {
    async_reconnect(this);
    return;
  }
  return;
}

Assistant:

void error_callback(const asio::error_code &ec) {
    if (err_cb_) {
      err_cb_(ec);
    }

    if (enable_reconnect_) {
      async_reconnect();
    }
  }